

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QString * systemFallbackThemeName(void)

{
  bool bVar1;
  QPlatformTheme *pQVar2;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QPlatformTheme *theme;
  QVariant themeHint;
  QVariant *this;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pQVar2 = QGuiApplicationPrivate::platformTheme();
  if (pQVar2 != (QPlatformTheme *)0x0) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (*pQVar2->_vptr_QPlatformTheme[0xc])(&local_28,pQVar2,0xf);
    bVar1 = QVariant::isValid(this);
    if (bVar1) {
      QVariant::toString();
    }
    QVariant::~QVariant((QVariant *)&local_28);
    if (bVar1) goto LAB_0029d462;
  }
  QString::QString((QString *)0x29d462);
LAB_0029d462:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

static QString systemFallbackThemeName()
{
    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
        const QVariant themeHint = theme->themeHint(QPlatformTheme::SystemIconFallbackThemeName);
        if (themeHint.isValid())
            return themeHint.toString();
    }
    return QString();
}